

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

path * __thiscall irr::io::SNamedPath::PathToName(SNamedPath *this,path *p)

{
  string<char> *in_RSI;
  string<char> *in_RDI;
  path *name;
  string<char> *in_stack_ffffffffffffffc8;
  string<char> *psVar1;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  
  uVar2 = 0;
  psVar1 = in_RDI;
  core::string<char>::string(in_RDI,in_stack_ffffffffffffffc8);
  core::string<char>::replace
            ((string<char> *)CONCAT17(uVar2,in_stack_ffffffffffffffe0),(char)((ulong)psVar1 >> 0x38)
             ,(char)((ulong)psVar1 >> 0x30));
  core::string<char>::make_lower(in_RSI);
  return in_RDI;
}

Assistant:

path PathToName(const path &p) const
	{
		path name(p);
		name.replace('\\', '/');
		name.make_lower();
		return name;
	}